

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-surface.c
# Opt level: O0

plutovg_surface_t * plutovg_surface_create_for_data(uchar *data,int width,int height,int stride)

{
  plutovg_surface_t *ppVar1;
  plutovg_surface_t *surface;
  int stride_local;
  int height_local;
  int width_local;
  uchar *data_local;
  
  ppVar1 = (plutovg_surface_t *)malloc(0x18);
  ppVar1->ref_count = 1;
  ppVar1->width = width;
  ppVar1->height = height;
  ppVar1->stride = stride;
  ppVar1->data = data;
  return ppVar1;
}

Assistant:

plutovg_surface_t* plutovg_surface_create_for_data(unsigned char* data, int width, int height, int stride)
{
    plutovg_surface_t* surface = malloc(sizeof(plutovg_surface_t));
    surface->ref_count = 1;
    surface->width = width;
    surface->height = height;
    surface->stride = stride;
    surface->data = data;
    return surface;
}